

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RenameExprlistUnmap(Parse *pParse,ExprList *pEList)

{
  undefined1 local_50 [8];
  Walker sWalker;
  int i;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  if (pEList != (ExprList *)0x0) {
    memset(local_50,0,0x30);
    sWalker.pParse = (Parse *)renameUnmapExprCb;
    local_50 = (undefined1  [8])pParse;
    sqlite3WalkExprList((Walker *)local_50,pEList);
    for (sWalker.u._4_4_ = 0; (int)sWalker.u._4_4_ < pEList->nExpr;
        sWalker.u._4_4_ = sWalker.u._4_4_ + 1) {
      if ((*(ushort *)&pEList->a[(int)sWalker.u._4_4_].fg.field_0x1 & 3) == 0) {
        sqlite3RenameTokenRemap(pParse,(void *)0x0,pEList->a[(int)sWalker.u._4_4_].zEName);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameExprlistUnmap(Parse *pParse, ExprList *pEList){
  if( pEList ){
    int i;
    Walker sWalker;
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = pParse;
    sWalker.xExprCallback = renameUnmapExprCb;
    sqlite3WalkExprList(&sWalker, pEList);
    for(i=0; i<pEList->nExpr; i++){
      if( ALWAYS(pEList->a[i].fg.eEName==ENAME_NAME) ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pEList->a[i].zEName);
      }
    }
  }
}